

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

type_conflict2
jsoncons::detail::from_integer<int,jsoncons::string_sink<std::__cxx11::wstring>>
          (int value,
          string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *result)

{
  int iVar1;
  uint uVar2;
  assertion_error *this;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  type_conflict2 tVar6;
  int *piVar7;
  char_type buf [255];
  string local_448;
  int local_428 [258];
  
  uVar4 = 0;
  iVar1 = value;
  if (value < 0) {
    do {
      *(int *)((long)local_428 + uVar4) = ((iVar1 / 10) * 10 - iVar1) + 0x30;
      uVar5 = uVar4 + 4;
      if (0x3f7 < uVar4) break;
      uVar2 = iVar1 - 10;
      uVar4 = uVar5;
      iVar1 = iVar1 / 10;
    } while (uVar2 < 0xffffffed);
  }
  else {
    uVar3 = (ulong)(uint)value;
    do {
      uVar2 = (uint)uVar3;
      *(uint *)((long)local_428 + uVar4) = (int)(uVar3 / 10) * -10 + uVar2 + 0x30;
      uVar5 = uVar4 + 4;
      if (0x3f7 < uVar4) break;
      uVar3 = uVar3 / 10;
      uVar4 = uVar5;
    } while (9 < uVar2);
  }
  if (uVar5 == 0x3fc) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_448,"assertion \'p != last\' failed at  <> :0","");
    assertion_error::assertion_error(this,&local_448);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar6 = uVar5 >> 2;
  if (value < 0) {
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    tVar6 = tVar6 + 1;
  }
  for (piVar7 = (int *)((long)local_428 + (uVar5 - 4)); local_428 <= piVar7; piVar7 = piVar7 + -1) {
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
  }
  return tVar6;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }